

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-pta-ben.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  LLVMPointerAnalysisOptions *pLVar2;
  char **in_RSI;
  uint in_EDI;
  DGLLVMPointerAnalysis PTA;
  LLVMPointerAnalysisOptions *opts;
  TimeMeasure tm;
  unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> M;
  LLVMContext context;
  SlicerOptions options;
  SlicerOptions *in_stack_fffffffffffffc20;
  string local_3d8 [24];
  DGLLVMPointerAnalysis *in_stack_fffffffffffffc40;
  string *in_stack_fffffffffffffc48;
  TimeMeasure *in_stack_fffffffffffffc50;
  LLVMPointerAnalysisOptions *in_stack_fffffffffffffcb0;
  Module *in_stack_fffffffffffffcb8;
  DGLLVMPointerAnalysis *in_stack_fffffffffffffcc0;
  char local_290 [8];
  SlicerOptions local_288;
  char **local_10;
  uint local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  setupStackTraceOnError(in_EDI,in_RSI);
  parseSlicerOptions((int)&local_288 + 8,(char **)(ulong)local_8,SUB81(local_10,0),false);
  llvm::cl::opt_storage::operator_cast_to_bool((opt_storage<bool,_false,_false> *)0x14d74c);
  llvm::LLVMContext::LLVMContext((LLVMContext *)&local_288);
  parseModule(local_290,(LLVMContext *)"llvm-pta-ben",&local_288);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)0x14d792);
  if (bVar1) {
    dg::debug::TimeMeasure::TimeMeasure((TimeMeasure *)in_stack_fffffffffffffc20);
    pLVar2 = (LLVMPointerAnalysisOptions *)
             std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::get
                       ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)0x14d7db);
    dg::LLVMPointerAnalysisOptions::LLVMPointerAnalysisOptions
              ((LLVMPointerAnalysisOptions *)in_stack_fffffffffffffc20,pLVar2);
    dg::DGLLVMPointerAnalysis::DGLLVMPointerAnalysis
              (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
    dg::LLVMPointerAnalysisOptions::~LLVMPointerAnalysisOptions
              ((LLVMPointerAnalysisOptions *)in_stack_fffffffffffffc20);
    dg::debug::TimeMeasure::start((TimeMeasure *)in_stack_fffffffffffffc20);
    dg::DGLLVMPointerAnalysis::run((DGLLVMPointerAnalysis *)in_stack_fffffffffffffc20);
    dg::debug::TimeMeasure::stop((TimeMeasure *)in_stack_fffffffffffffc20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_3d8,"INFO: Pointer analysis took",(allocator *)&stack0xfffffffffffffc27);
    dg::debug::TimeMeasure::report
              (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
               (ostream *)in_stack_fffffffffffffc40);
    std::__cxx11::string::~string(local_3d8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffc27);
    evalPTA(in_stack_fffffffffffffc40);
    local_4 = 0;
    dg::DGLLVMPointerAnalysis::~DGLLVMPointerAnalysis
              ((DGLLVMPointerAnalysis *)in_stack_fffffffffffffc20);
  }
  else {
    local_4 = 1;
  }
  std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::~unique_ptr
            ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)
             in_stack_fffffffffffffc20);
  llvm::LLVMContext::~LLVMContext((LLVMContext *)&local_288);
  SlicerOptions::~SlicerOptions(in_stack_fffffffffffffc20);
  return local_4;
}

Assistant:

int main(int argc, char *argv[]) {
    setupStackTraceOnError(argc, argv);
    SlicerOptions options = parseSlicerOptions(argc, argv);

    if (enable_debug) {
        DBG_ENABLE();
    }

    llvm::LLVMContext context;
    std::unique_ptr<llvm::Module> M =
            parseModule("llvm-pta-ben", context, options);
    if (!M)
        return 1;

    TimeMeasure tm;
    auto &opts = options.dgOptions.PTAOptions;

    DGLLVMPointerAnalysis PTA(M.get(), opts);

    tm.start();

    PTA.run();

    tm.stop();
    tm.report("INFO: Pointer analysis took");

    evalPTA(&PTA);

    return 0;
}